

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

double calc_frame_boost(PRIMARY_RATE_CONTROL *p_rc,FRAME_INFO *frame_info,
                       FIRSTPASS_STATS *this_frame,double this_frame_mv_in_out,double max_boost)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = av1_convert_qindex_to_q(p_rc->avg_frame_qindex[1],frame_info->bit_depth);
  dVar1 = dVar1 * 0.015 + 0.5;
  if (1.5 <= dVar1) {
    dVar1 = 1.5;
  }
  dVar2 = calculate_active_area(frame_info,this_frame);
  dVar3 = dVar2 * this_frame->intra_error;
  dVar4 = *(double *)
           (&DAT_0045fd50 +
           (ulong)((uint)(frame_info->frame_width * frame_info->frame_height) < 0x38401) * 8) *
          dVar2;
  if (*(double *)
       (&DAT_0045fd50 +
       (ulong)((uint)(frame_info->frame_width * frame_info->frame_height) < 0x38401) * 8) * dVar2 <=
      dVar3) {
    dVar4 = dVar3;
  }
  dVar4 = (dVar4 / (this_frame->coded_error +
                   *(double *)(&DAT_0043da80 + (ulong)(this_frame->coded_error < 0.0) * 8))) * 12.5
          * dVar1;
  dVar4 = this_frame_mv_in_out *
          *(double *)(&DAT_0045fd60 + (ulong)(0.0 < this_frame_mv_in_out) * 8) * dVar4 + dVar4;
  if (dVar1 * 90.0 <= dVar4) {
    dVar4 = dVar1 * 90.0;
  }
  return dVar4;
}

Assistant:

static double calc_frame_boost(const PRIMARY_RATE_CONTROL *p_rc,
                               const FRAME_INFO *frame_info,
                               const FIRSTPASS_STATS *this_frame,
                               double this_frame_mv_in_out, double max_boost) {
  double frame_boost;
  const double lq = av1_convert_qindex_to_q(p_rc->avg_frame_qindex[INTER_FRAME],
                                            frame_info->bit_depth);
  const double boost_q_correction = AOMMIN((0.5 + (lq * 0.015)), 1.5);
  const double active_area = calculate_active_area(frame_info, this_frame);

  // Underlying boost factor is based on inter error ratio.
  frame_boost = AOMMAX(baseline_err_per_mb(frame_info) * active_area,
                       this_frame->intra_error * active_area) /
                DOUBLE_DIVIDE_CHECK(this_frame->coded_error);
  frame_boost = frame_boost * BOOST_FACTOR * boost_q_correction;

  // Increase boost for frames where new data coming into frame (e.g. zoom out).
  // Slightly reduce boost if there is a net balance of motion out of the frame
  // (zoom in). The range for this_frame_mv_in_out is -1.0 to +1.0.
  if (this_frame_mv_in_out > 0.0)
    frame_boost += frame_boost * (this_frame_mv_in_out * 2.0);
  // In the extreme case the boost is halved.
  else
    frame_boost += frame_boost * (this_frame_mv_in_out / 2.0);

  return AOMMIN(frame_boost, max_boost * boost_q_correction);
}